

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UTApprovals.h
# Opt level: O2

void __thiscall ApprovalTests::cfg::reporter::on(reporter *this,test_end test_end)

{
  while ((this->currentTest).sections.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->currentTest).sections.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&(this->currentTest).sections);
  }
  boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on
            (&this->super_reporter<boost::ext::ut::v1_1_8::printer>,test_end);
  return;
}

Assistant:

auto on(boost::ut::events::test_end test_end) -> void
            {
                while (!currentTest.sections.empty())
                {
                    currentTest.sections.pop_back();
                }
                boost::ut::reporter<boost::ut::printer>::on(test_end);
            }